

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::iterate(TextureGatherCase *this)

{
  int *value;
  TextureFormat *pTVar1;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_00;
  IVec3 *pIVar2;
  TextureType TVar3;
  ChannelOrder CVar4;
  ChannelType CVar5;
  uint uVar6;
  TextureFormat log;
  RenderContext *renderCtx;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  int iVar7;
  DataType dataType;
  undefined4 extraout_var;
  ShaderProgram *pSVar8;
  ProgramSources *pPVar9;
  ulong uVar10;
  long lVar11;
  TestError *pTVar12;
  char cVar13;
  TextureFormat *textureFormat;
  char *pcVar14;
  undefined4 uVar15;
  DataType dataType_00;
  IterateResult IVar16;
  char *pcVar17;
  int iVar18;
  GatherType GVar19;
  char *__rhs;
  bool bVar20;
  char cVar21;
  bool bVar22;
  undefined4 uVar23;
  uint in_stack_fffffffffffff9ec;
  undefined1 in_stack_fffffffffffff9f0;
  char cVar24;
  char cVar25;
  GatherType GVar26;
  allocator<char> local_5fa;
  allocator<char> local_5f9;
  string fragmentSource;
  string vertexSource;
  string texCoordType;
  deUint16 indices [6];
  float position [8];
  ScopedLogSection iterationSection;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  undefined1 local_3c4 [28];
  Vec2 texCoordVec [4];
  Vector<float,_3> local_384 [14];
  string refZExpr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string funcCall;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  TextureLevel readResult;
  TextureFormat local_54 [4];
  
  log = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  value = &this->m_currentIteration;
  de::toString<int>((string *)texCoordVec,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&readResult,
                 "Iteration",(string *)texCoordVec);
  de::toString<int>(&texCoordType,value);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)position,
                 "Iteration ",&texCoordType);
  tcu::ScopedLogSection::ScopedLogSection
            (&iterationSection,(TestLog *)log,(string *)&readResult,(string *)position);
  std::__cxx11::string::~string((string *)position);
  std::__cxx11::string::~string((string *)&texCoordType);
  std::__cxx11::string::~string((string *)&readResult);
  std::__cxx11::string::~string((string *)texCoordVec);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar7 = (*renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar7);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (local_54,this,(ulong)(uint)this->m_currentIteration);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&refZExpr,"v_normalizedCoord.x",(allocator<char> *)&readResult);
  GVar26 = this->m_gatherType;
  cVar24 = true;
  if (GVar26 != GATHERTYPE_OFFSET_DYNAMIC) {
    cVar24 = ((this->m_textureFormat).order - D & 0xfffffffd) == 0;
  }
  pSVar8 = (ShaderProgram *)operator_new(0xd0);
  TVar3 = this->m_textureType;
  uVar10 = (ulong)TVar3;
  getOffsetRange((TextureGatherCase *)local_3c4);
  pTVar1 = &this->m_textureFormat;
  CVar4 = pTVar1->order;
  cVar13 = GVar26 == GATHERTYPE_OFFSET_DYNAMIC || (CVar4 - D & 0xfffffffd) == 0;
  bVar20 = CVar4 != D;
  dataType = TYPE_LAST;
  uVar15 = 0xffffffff;
  cVar21 = CVar4 == DS;
  if (((bool)cVar21) || (CVar4 == D)) {
    if (TVar3 < TEXTURETYPE_3D) {
      dataType = *(DataType *)(&DAT_008513a4 + uVar10 * 4);
      uVar15 = *(undefined4 *)(&DAT_008513b0 + uVar10 * 4);
    }
  }
  else {
    if (uVar10 == 2) {
      dataType = glu::getSampler2DArrayType(*pTVar1);
    }
    else {
      if (TVar3 != TEXTURETYPE_CUBE) {
        if (TVar3 == TEXTURETYPE_2D) {
          dataType = glu::getSampler2DType(*pTVar1);
          uVar15 = 2;
        }
        goto LAB_005806dc;
      }
      dataType = glu::getSamplerCubeType(*pTVar1);
    }
    uVar15 = 3;
  }
LAB_005806dc:
  uVar23 = 1;
  textureFormat = local_54;
  genGatherFuncCall(&funcCall,(TextureGatherCase *)(ulong)GVar26,(GatherType)pTVar1,textureFormat,
                    (GatherArgs *)&refZExpr,(string *)local_3c4,
                    (IVec2 *)CONCAT44(in_stack_fffffffffffff9ec,1),
                    CONCAT13(cVar21,CONCAT12(cVar13,CONCAT11(cVar24,in_stack_fffffffffffff9f0))));
  bVar22 = GVar26 != GATHERTYPE_OFFSET_DYNAMIC;
  memset(&readResult,0,0xac);
  local_298._M_dataplus._M_p._0_4_ = uVar15;
  de::toString<int>(&vertexSource,(int *)&local_298);
  std::operator+(&texCoordType,"vec",&vertexSource);
  GVar19 = GVar26 & ~GATHERTYPE_OFFSET;
  std::__cxx11::string::~string((string *)&vertexSource);
  pcVar17 = "${GPU_SHADER5_REQUIRE}\n";
  __rhs = SSBOArrayLengthTests::init::arraysSized + 1;
  if (GVar19 != GATHERTYPE_OFFSET_DYNAMIC) {
    pcVar17 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,pcVar17,(allocator<char> *)&local_2b8);
  std::operator+(&local_4e8,"${GLSL_VERSION_DECL}\n",&local_508);
  std::operator+(&local_4c8,&local_4e8,"\nin highp vec2 a_position;\nin highp ");
  std::operator+(&local_4a8,&local_4c8,&texCoordType);
  std::operator+(&local_488,&local_4a8," a_texCoord;\n");
  pcVar14 = "in highp vec2 a_normalizedCoord; // (0,0) to (1,1)\n";
  if (bVar22 && (bVar20 && cVar21 == '\0')) {
    pcVar14 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  cVar25 = cVar21;
  std::operator+(&local_468,&local_488,pcVar14);
  std::operator+(&local_448,&local_468,"\nout highp ");
  std::operator+(&local_428,&local_448,&texCoordType);
  std::operator+(&local_408,&local_428," v_texCoord;\n");
  pcVar14 = "out highp vec2 v_normalizedCoord;\n";
  if (bVar22 && (bVar20 && cVar21 == '\0')) {
    pcVar14 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator+(&local_3e8,&local_408,pcVar14);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)indices,
                 &local_3e8,
                 "\nvoid main (void)\n{\n\tgl_Position = vec4(a_position.x, a_position.y, 0.0, 1.0);\n\tv_texCoord = a_texCoord;\n"
                );
  pcVar14 = "\tv_normalizedCoord = a_normalizedCoord;\n";
  if (bVar22 && (bVar20 && cVar21 == '\0')) {
    pcVar14 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator+(&fragmentSource,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)indices,
                 pcVar14);
  std::operator+(&vertexSource,&fragmentSource,"}\n");
  std::__cxx11::string::~string((string *)&fragmentSource);
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&fragmentSource,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)vertexSource._M_dataplus._M_p,(char *)textureFormat);
  glu::VertexSource::VertexSource((VertexSource *)position,&fragmentSource);
  std::__cxx11::string::~string((string *)&fragmentSource);
  std::__cxx11::string::~string((string *)&vertexSource);
  std::__cxx11::string::~string((string *)&texCoordType);
  pPVar9 = glu::ProgramSources::operator<<((ProgramSources *)&readResult,(ShaderSource *)position);
  local_3c4._8_4_ = uVar15;
  de::toString<int>(&fragmentSource,(int *)(local_3c4 + 8));
  std::operator+(&vertexSource,"vec",&fragmentSource);
  cVar21 = cVar13;
  std::__cxx11::string::~string((string *)&fragmentSource);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,pcVar17,&local_5f9);
  std::operator+(&local_218,"${GLSL_VERSION_DECL}\n",&local_238);
  std::operator+(&local_1f8,&local_218,"\nlayout (location = 0) out mediump ");
  if (dataType - TYPE_SAMPLER_2D < 0x18) {
    textureFormat = (TextureFormat *)&DAT_008513bc;
    dataType_00 = *(DataType *)(&DAT_008513bc + (ulong)(dataType - TYPE_SAMPLER_2D) * 4);
  }
  else {
    dataType_00 = TYPE_LAST;
  }
  pcVar17 = glu::getDataTypeName(dataType_00);
  std::operator+(&local_2b8,&local_1f8,pcVar17);
  std::operator+(&local_298,&local_2b8," o_color;\n\nin highp ");
  std::operator+(&local_508,&local_298,&vertexSource);
  std::operator+(&local_4e8,&local_508," v_texCoord;\n");
  pcVar17 = "in highp vec2 v_normalizedCoord;\n";
  if (cVar13 == '\0') {
    pcVar17 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator+(&local_4c8,&local_4e8,pcVar17);
  std::operator+(&local_4a8,&local_4c8,"\nuniform highp ");
  pcVar17 = glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,pcVar17,&local_5fa);
  std::operator+(&local_488,&local_4a8,&local_258);
  std::operator+(&local_468,&local_488," u_sampler;\n");
  pcVar17 = "uniform highp vec2 u_viewportSize;\n";
  if (cVar13 == '\0') {
    pcVar17 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator+(&local_448,&local_468,pcVar17);
  std::operator+(&local_428,&local_448,"\nvoid main(void)\n{\n");
  if (GVar26 == GATHERTYPE_OFFSET_DYNAMIC) {
    __rhs = "\tivec2 pixCoord = ivec2(v_normalizedCoord*u_viewportSize);\n";
  }
  std::operator+(&local_408,&local_428,__rhs);
  std::operator+(&local_3e8,&local_408,"\to_color = ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)indices,
                 &local_3e8,&funcCall);
  std::operator+(&fragmentSource,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)indices,
                 ";\n}\n");
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)indices,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)fragmentSource._M_dataplus._M_p,(char *)textureFormat);
  glu::FragmentSource::FragmentSource((FragmentSource *)&texCoordType,(string *)indices);
  std::__cxx11::string::~string((string *)indices);
  std::__cxx11::string::~string((string *)&fragmentSource);
  std::__cxx11::string::~string((string *)&vertexSource);
  pPVar9 = glu::ProgramSources::operator<<(pPVar9,(ShaderSource *)&texCoordType);
  glu::ProgramSources::ProgramSources((ProgramSources *)texCoordVec,pPVar9);
  std::__cxx11::string::~string((string *)&texCoordType._M_string_length);
  std::__cxx11::string::~string((string *)(position + 2));
  glu::ProgramSources::~ProgramSources((ProgramSources *)&readResult);
  std::__cxx11::string::~string((string *)&funcCall);
  glu::ShaderProgram::ShaderProgram(pSVar8,renderCtx,(ProgramSources *)texCoordVec);
  local_3c4._12_8_ = 0;
  this_00 = &this->m_program;
  data.ptr._4_4_ = in_stack_fffffffffffff9ec;
  data.ptr._0_4_ = uVar23;
  data._8_1_ = in_stack_fffffffffffff9f0;
  data._9_1_ = cVar24;
  data._10_1_ = cVar21;
  data._11_1_ = cVar25;
  data._12_4_ = GVar26;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::assignData
            (&this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
             ,data);
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~UniqueBase
            ((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)
             (local_3c4 + 0xc));
  glu::ProgramSources::~ProgramSources((ProgramSources *)texCoordVec);
  if (*value == 0) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    (this->m_program).
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                    m_data.ptr);
  }
  else {
    readResult.m_format =
         (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    pIVar2 = &readResult.m_size;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar2);
    std::operator<<((ostream *)pIVar2,
                    "Using a program similar to the previous one, except with a gather function call as follows:\n"
                   );
    GVar19 = this->m_gatherType;
    getOffsetRange((TextureGatherCase *)position);
    genGatherFuncCall((string *)texCoordVec,(TextureGatherCase *)(ulong)GVar19,(GatherType)pTVar1,
                      local_54,(GatherArgs *)&refZExpr,(string *)position,
                      (IVec2 *)((ulong)in_stack_fffffffffffff9ec << 0x20),
                      CONCAT13(cVar25,CONCAT12(cVar21,CONCAT11(cVar24,in_stack_fffffffffffff9f0))));
    std::operator<<((ostream *)pIVar2,(string *)texCoordVec);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&readResult,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)texCoordVec);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pIVar2);
  }
  pSVar8 = (this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
           m_data.ptr;
  if ((pSVar8->m_program).m_info.linkOk == false) {
    if (*value != 0) {
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar8
                     );
    }
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,"Failed to build program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
               ,0x561);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar11 + 0x1a00))(0,0,0x40);
  (**(code **)(lVar11 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar11 + 0x188))(0x4000);
  position[4] = 1.0;
  position[5] = -1.0;
  position[6] = 1.0;
  position[7] = 1.0;
  position[0] = -1.0;
  position[1] = -1.0;
  position[2] = -1.0;
  position[3] = 1.0;
  texCoordType.field_2._M_allocated_capacity = 0x3f800000;
  texCoordType.field_2._8_8_ = 0x3f8000003f800000;
  texCoordType._M_dataplus._M_p._0_4_ = 0;
  texCoordType._M_dataplus._M_p._4_4_ = 0;
  texCoordType._M_string_length._0_4_ = 0;
  texCoordType._M_string_length._4_4_ = 0x3f800000;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
            (&vertexSource,this,(ulong)(uint)this->m_currentIteration);
  fragmentSource._M_dataplus._M_p = (pointer)0x0;
  fragmentSource._M_string_length = 0;
  fragmentSource.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)texCoordVec,"a_position",(allocator<char> *)indices);
  glu::va::Float((VertexArrayBinding *)&readResult,(string *)texCoordVec,2,4,0,position);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &fragmentSource,(VertexArrayBinding *)&readResult);
  std::__cxx11::string::~string((string *)&readResult.m_size);
  std::__cxx11::string::~string((string *)texCoordVec);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)texCoordVec,"a_texCoord",(allocator<char> *)indices);
  uVar10 = vertexSource._M_string_length - (long)vertexSource._M_dataplus._M_p >> 2;
  glu::va::Float((VertexArrayBinding *)&readResult,(string *)texCoordVec,
                 (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) / 4)
                 ,4,0,(float *)vertexSource._M_dataplus._M_p);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &fragmentSource,(VertexArrayBinding *)&readResult);
  std::__cxx11::string::~string((string *)&readResult.m_size);
  std::__cxx11::string::~string((string *)texCoordVec);
  if (cVar24 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)texCoordVec,"a_normalizedCoord",(allocator<char> *)indices);
    glu::va::Float((VertexArrayBinding *)&readResult,(string *)texCoordVec,2,4,0,
                   (float *)&texCoordType);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
               &fragmentSource,(VertexArrayBinding *)&readResult);
    std::__cxx11::string::~string((string *)&readResult.m_size);
    std::__cxx11::string::~string((string *)texCoordVec);
  }
  indices[0] = 0;
  indices[1] = 1;
  indices[2] = 2;
  indices[3] = 2;
  indices[4] = 1;
  indices[5] = 3;
  (**(code **)(lVar11 + 0x1680))
            ((((this_00->
               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data
              .ptr)->m_program).m_program);
  iVar7 = (**(code **)(lVar11 + 0xb48))
                    ((((this_00->
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       ).m_data.ptr)->m_program).m_program);
  if (iVar7 < 0) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar12,(char *)0x0,"samplerUniformLocation >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
               ,0x589);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar11 + 0x14f0))(iVar7,0);
  if (GVar26 == GATHERTYPE_OFFSET_DYNAMIC) {
    iVar7 = (**(code **)(lVar11 + 0xb48))
                      ((((this_00->
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                         ).m_data.ptr)->m_program).m_program);
    if (iVar7 < 0) {
      pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar12,(char *)0x0,"viewportSizeUniformLocation >= 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                 ,0x590);
      __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar11 + 0x1520))(0x42800000,0x42800000,iVar7);
  }
  lVar11 = (long)(vertexSource._M_string_length - (long)vertexSource._M_dataplus._M_p) >> 2;
  if (lVar11 == 0xc) {
    lVar11 = 0;
    do {
      tcu::Vector<float,_3>::Vector((Vector<float,_3> *)((long)texCoordVec[0].m_data + lVar11));
      lVar11 = lVar11 + 0xc;
    } while (lVar11 != 0x30);
    computeTexCoordVecs<3>
              ((vector<float,_std::allocator<float>_> *)&vertexSource,
               (Vector<float,_3> (*) [4])texCoordVec);
    pIVar2 = &readResult.m_size;
    readResult.m_format = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar2);
    std::operator<<((ostream *)pIVar2,"Texture coordinates run from ");
    tcu::operator<<((ostream *)pIVar2,(Vector<float,_3> *)texCoordVec);
    std::operator<<((ostream *)pIVar2," to ");
    tcu::operator<<((ostream *)pIVar2,local_384);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&readResult,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00581316:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&readResult.m_size);
  }
  else if (lVar11 == 8) {
    texCoordVec[2].m_data[0] = 0.0;
    texCoordVec[2].m_data[1] = 0.0;
    texCoordVec[3].m_data[0] = 0.0;
    texCoordVec[3].m_data[1] = 0.0;
    texCoordVec[0].m_data[0] = 0.0;
    texCoordVec[0].m_data[1] = 0.0;
    texCoordVec[1].m_data[0] = 0.0;
    texCoordVec[1].m_data[1] = 0.0;
    computeTexCoordVecs<2>((vector<float,_std::allocator<float>_> *)&vertexSource,&texCoordVec);
    pIVar2 = &readResult.m_size;
    readResult.m_format = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar2);
    std::operator<<((ostream *)pIVar2,"Texture coordinates run from ");
    tcu::operator<<((ostream *)pIVar2,texCoordVec);
    std::operator<<((ostream *)pIVar2," to ");
    tcu::operator<<((ostream *)pIVar2,texCoordVec + 3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&readResult,(EndMessageToken *)&tcu::TestLog::EndMessage);
    goto LAB_00581316;
  }
  readResult.m_format.order = R;
  readResult.m_format.type = UNORM_INT32;
  readResult.m_size.m_data[0] = 1;
  readResult._16_8_ = (allocator<char> *)indices;
  glu::draw(renderCtx,
            (((this_00->
              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
             ptr)->m_program).m_program,
            (int)((long)(fragmentSource._M_string_length - (long)fragmentSource._M_dataplus._M_p) /
                 0x50),(VertexArrayBinding *)fragmentSource._M_dataplus._M_p,
            (PrimitiveList *)&readResult,(DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &fragmentSource);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&vertexSource);
  IVar16 = CONTINUE;
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&texCoordType,&this->m_colorBufferFormat,0x40,0x40,1);
  if ((this->m_colorBufferFormat).order == RGBA) {
    CVar5 = (this->m_colorBufferFormat).type;
    if (((ulong)CVar5 < 0x22) && ((0x220000008U >> ((ulong)CVar5 & 0x3f) & 1) != 0)) {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&readResult,(TextureLevel *)&texCoordType);
      glu::readPixels(renderCtx,0,0,(PixelBufferAccess *)&readResult);
    }
    else {
      if (CVar5 - SIGNED_INT8 < 3) {
        texCoordVec[0].m_data[1] = 4.06377e-44;
      }
      else {
        if ((UNSIGNED_INT32 < CVar5) || ((0x2c0000000U >> ((ulong)CVar5 & 0x3f) & 1) == 0))
        goto LAB_005814cc;
        texCoordVec[0].m_data[1] = 4.62428e-44;
      }
      texCoordVec[0].m_data[0] = 1.12104e-44;
      tcu::TextureLevel::TextureLevel(&readResult,(TextureFormat *)texCoordVec,0x40,0x40,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)texCoordVec,&readResult);
      glu::readPixels(renderCtx,0,0,(PixelBufferAccess *)texCoordVec);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)texCoordVec,(TextureLevel *)&texCoordType);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)position,&readResult);
      tcu::copy((EVP_PKEY_CTX *)texCoordVec,(EVP_PKEY_CTX *)position);
      tcu::TextureLevel::~TextureLevel(&readResult);
    }
  }
LAB_005814cc:
  uVar6 = *value;
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&readResult,(TextureLevel *)&texCoordType);
  iVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                    (this,(ulong)uVar6,&readResult);
  if ((char)iVar7 == '\0') {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Result verification failed");
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&texCoordType);
    IVar16 = STOP;
  }
  else {
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&texCoordType);
    iVar18 = this->m_currentIteration + 1;
    this->m_currentIteration = iVar18;
    iVar7 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
    if (iVar18 == iVar7) {
      IVar16 = STOP;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  std::__cxx11::string::~string((string *)&refZExpr);
  tcu::ScopedLogSection::~ScopedLogSection(&iterationSection);
  return IVar16;
}

Assistant:

TextureGatherCase::IterateResult TextureGatherCase::iterate (void)
{
	TestLog&						log								= m_testCtx.getLog();
	const tcu::ScopedLogSection		iterationSection				(log, "Iteration" + de::toString(m_currentIteration), "Iteration " + de::toString(m_currentIteration));
	const glu::RenderContext&		renderCtx						= m_context.getRenderContext();
	const glw::Functions&			gl								= renderCtx.getFunctions();
	const GatherArgs&				gatherArgs						= getGatherArgs(m_currentIteration);
	const string					refZExpr						= "v_normalizedCoord.x";
	const bool						needPixelCoordInShader			= m_gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool						needNormalizedCoordInShader		= needPixelCoordInShader || isDepthFormat(m_textureFormat);

	// Generate a program appropriate for this iteration.

	m_program = MovePtr<ShaderProgram>(new ShaderProgram(renderCtx, genProgramSources(m_gatherType, m_textureType, m_textureFormat, gatherArgs, refZExpr, getOffsetRange())));
	if (m_currentIteration == 0)
		m_testCtx.getLog() << *m_program;
	else
		m_testCtx.getLog() << TestLog::Message << "Using a program similar to the previous one, except with a gather function call as follows:\n"
											   << genGatherFuncCall(m_gatherType, m_textureFormat, gatherArgs, refZExpr, getOffsetRange(), 0)
											   << TestLog::EndMessage;
	if (!m_program->isOk())
	{
		if (m_currentIteration != 0)
			m_testCtx.getLog() << *m_program;
		TCU_FAIL("Failed to build program");
	}

	// Render.

	gl.viewport(0, 0, RENDER_SIZE.x(), RENDER_SIZE.y());
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	{
		const float position[4*2] =
		{
			-1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
		};

		const float normalizedCoord[4*2] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f,
		};

		const vector<float> texCoord = computeQuadTexCoord(m_currentIteration);

		vector<glu::VertexArrayBinding> attrBindings;
		attrBindings.push_back(glu::va::Float("a_position", 2, 4, 0, &position[0]));
		attrBindings.push_back(glu::va::Float("a_texCoord", (int)texCoord.size()/4, 4, 0, &texCoord[0]));
		if (needNormalizedCoordInShader)
			attrBindings.push_back(glu::va::Float("a_normalizedCoord", 2, 4, 0, &normalizedCoord[0]));

		const deUint16 indices[6] = { 0, 1, 2, 2, 1, 3 };

		gl.useProgram(m_program->getProgram());

		{
			const int samplerUniformLocation = gl.getUniformLocation(m_program->getProgram(), "u_sampler");
			TCU_CHECK(samplerUniformLocation >= 0);
			gl.uniform1i(samplerUniformLocation, 0);
		}

		if (needPixelCoordInShader)
		{
			const int viewportSizeUniformLocation = gl.getUniformLocation(m_program->getProgram(), "u_viewportSize");
			TCU_CHECK(viewportSizeUniformLocation >= 0);
			gl.uniform2f(viewportSizeUniformLocation, (float)RENDER_SIZE.x(), (float)RENDER_SIZE.y());
		}

		if (texCoord.size() == 2*4)
		{
			Vec2 texCoordVec[4];
			computeTexCoordVecs(texCoord, texCoordVec);
			log << TestLog::Message << "Texture coordinates run from " << texCoordVec[0] << " to " << texCoordVec[3] << TestLog::EndMessage;
		}
		else if (texCoord.size() == 3*4)
		{
			Vec3 texCoordVec[4];
			computeTexCoordVecs(texCoord, texCoordVec);
			log << TestLog::Message << "Texture coordinates run from " << texCoordVec[0] << " to " << texCoordVec[3] << TestLog::EndMessage;
		}
		else
			DE_ASSERT(false);

		glu::draw(renderCtx, m_program->getProgram(), (int)attrBindings.size(), &attrBindings[0],
			glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
	}

	// Verify result.

	{
		const tcu::TextureLevel rendered = getPixels(renderCtx, RENDER_SIZE, m_colorBufferFormat);

		if (!verify(m_currentIteration, rendered.getAccess()))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result verification failed");
			return STOP;
		}
	}

	m_currentIteration++;
	if (m_currentIteration == (int)getNumIterations())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	else
		return CONTINUE;
}